

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.h
# Opt level: O3

char * el::LevelHelper::convertToString(Level level)

{
  int iVar1;
  undefined6 in_register_0000003a;
  
  iVar1 = (int)CONCAT62(in_register_0000003a,level);
  if (iVar1 < 0x10) {
    switch(iVar1) {
    case 1:
      return "GLOBAL";
    case 2:
      return "TRACE";
    case 4:
      return "DEBUG";
    case 8:
      return "FATAL";
    }
  }
  else if (iVar1 < 0x40) {
    if (iVar1 == 0x10) {
      return "ERROR";
    }
    if (iVar1 == 0x20) {
      return "WARNING";
    }
  }
  else {
    if (iVar1 == 0x40) {
      return "VERBOSE";
    }
    if (iVar1 == 0x80) {
      return "INFO";
    }
  }
  return "UNKNOWN";
}

Assistant:

static const char* convertToString(Level level) {
       // Do not use switch over strongly typed enums because Intel C++ compilers dont support them yet.
        if (level == Level::Global) return "GLOBAL";
        if (level == Level::Debug) return "DEBUG";
        if (level == Level::Info) return "INFO";
        if (level == Level::Warning) return "WARNING";
        if (level == Level::Error) return "ERROR";
        if (level == Level::Fatal) return "FATAL";
        if (level == Level::Verbose) return "VERBOSE";
        if (level == Level::Trace) return "TRACE";
        return "UNKNOWN";
    }